

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int * f3_get_stem_contributions_d0
                (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  int *piVar1;
  int *piVar2;
  vrna_param_t *pvVar3;
  code *pcVar4;
  code *pcVar5;
  uint uVar6;
  uchar uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  void *__ptr;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  undefined4 in_register_00000034;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  char *local_b8;
  char **local_98;
  
  uVar10 = fc->length;
  lVar11 = (long)(int)uVar10;
  iVar23 = fc->window_size;
  pvVar3 = fc->params;
  lVar20 = (long)i;
  lVar14 = *(long *)((fc->matrices->field_2).field_0.c + lVar20 * 2);
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_98 = fc->ptype_local;
    uVar8 = 1;
    local_b8 = (char *)0x0;
  }
  else {
    uVar8 = (fc->field_23).field_1.n_seq;
    local_b8 = (fc->field_23).field_0.ptype_pf_compat;
    local_98 = (char **)0x0;
  }
  lVar15 = lVar14 + lVar20 * -4;
  iVar9 = (pvVar3->model_details).min_loop_size;
  pvVar12 = vrna_alloc(iVar23 * 4 + 0x18);
  piVar1 = (int *)((long)pvVar12 + lVar20 * -4);
  pcVar4 = (code *)sc_wrapper->red_stem;
  pcVar5 = (code *)sc_wrapper->decomp_stem;
  uVar17 = iVar23 + i;
  uVar6 = uVar10 - 1;
  if (uVar17 <= uVar10 - 1) {
    uVar6 = uVar17;
  }
  lVar16 = (long)(int)uVar6;
  uVar22 = (ulong)uVar8;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    __ptr = vrna_alloc(uVar8 * 2);
    for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
      *(undefined2 *)((long)__ptr + uVar21 * 2) =
           *(undefined2 *)(*(long *)(local_b8 + uVar21 * 8) + lVar20 * 2);
    }
    lVar14 = (long)(i + iVar9);
    while (lVar18 = lVar14, lVar18 < lVar16) {
      lVar14 = lVar18 + 1;
      piVar1[lVar18 + 1] = 10000000;
      if ((*(int *)(lVar15 + 4 + lVar18 * 4) != 10000000) &&
         (uVar7 = (*evaluate)(i,uVar10,(int)lVar14,(int)lVar18 + 2,'\x10',hc_dat_local),
         uVar7 != '\0')) {
        iVar23 = *(int *)(lVar15 + 4 + lVar18 * 4);
        for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
          uVar8 = vrna_get_ptype_md((int)*(short *)((long)__ptr + uVar21 * 2),
                                    (int)*(short *)(*(long *)(local_b8 + uVar21 * 8) + 2 +
                                                   lVar18 * 2),&pvVar3->model_details);
          iVar19 = 0;
          if (2 < uVar8) {
            iVar19 = pvVar3->TerminalAU;
          }
          iVar23 = iVar23 + iVar19;
        }
        piVar1[lVar18 + 1] = iVar23;
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_SINGLE) {
    iVar23 = iVar9 + i;
    lVar13 = (long)iVar23 * 4 + lVar20 * -4;
    lVar18 = lVar13 + 4;
    lVar14 = lVar13 + lVar14 + 4;
    __ptr = (void *)0x0;
    for (lVar13 = 0; lVar13 + iVar23 < lVar16; lVar13 = lVar13 + 1) {
      *(undefined4 *)((long)pvVar12 + lVar13 * 4 + lVar18) = 10000000;
      if (*(int *)(lVar14 + lVar13 * 4) != 10000000) {
        iVar19 = iVar23 + (int)lVar13 + 1;
        uVar7 = (*evaluate)(i,uVar10,iVar19,iVar23 + (int)lVar13 + 2,'\x10',hc_dat_local);
        if (uVar7 != '\0') {
          uVar8 = vrna_get_ptype_window(i,iVar19,local_98);
          iVar19 = 0;
          if (2 < uVar8) {
            iVar19 = pvVar3->TerminalAU;
          }
          *(int *)((long)pvVar12 + lVar13 * 4 + lVar18) = iVar19 + *(int *)(lVar14 + lVar13 * 4);
        }
      }
    }
  }
  else {
    __ptr = (void *)0x0;
  }
  if (pcVar5 != (code *)0x0) {
    iVar23 = iVar9 + i + 2;
    lVar14 = lVar20 * -4 + 4;
    for (lVar20 = (long)(iVar9 + i); lVar20 < lVar16; lVar20 = lVar20 + 1) {
      if (*(int *)((long)pvVar12 + lVar20 * 4 + lVar14) != 10000000) {
        iVar9 = (*pcVar5)(CONCAT44(in_register_00000034,i),iVar23 + -1,iVar23,sc_wrapper);
        piVar2 = (int *)((long)pvVar12 + lVar20 * 4 + lVar14);
        *piVar2 = *piVar2 + iVar9;
      }
      iVar23 = iVar23 + 1;
    }
  }
  if (uVar17 < uVar10) {
    piVar1[(long)(int)uVar17 + 1] = 10000000;
  }
  else {
    piVar1[lVar11] = 10000000;
    if ((*(int *)(lVar15 + lVar11 * 4) != 10000000) &&
       (uVar7 = (*evaluate)(i,uVar10,i,uVar10,'\x0e',hc_dat_local), uVar7 != '\0')) {
      iVar23 = *(int *)(lVar15 + lVar11 * 4);
      if (fc->type == VRNA_FC_TYPE_SINGLE) {
        uVar10 = vrna_get_ptype_window(i,uVar10,local_98);
        iVar9 = 0;
        if (2 < uVar10) {
          iVar9 = pvVar3->TerminalAU;
        }
        iVar23 = iVar23 + iVar9;
      }
      else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
          uVar10 = vrna_get_ptype_md((int)*(short *)((long)__ptr + uVar21 * 2),
                                     (int)*(short *)(*(long *)(local_b8 + uVar21 * 8) + lVar11 * 2),
                                     &pvVar3->model_details);
          iVar9 = 0;
          if (2 < uVar10) {
            iVar9 = pvVar3->TerminalAU;
          }
          iVar23 = iVar23 + iVar9;
        }
      }
      if (pcVar4 != (code *)0x0) {
        iVar9 = (*pcVar4)(CONCAT44(in_register_00000034,i),i,lVar11,sc_wrapper);
        iVar23 = iVar23 + iVar9;
      }
      piVar1[lVar11] = iVar23;
    }
  }
  free(__ptr);
  return piVar1;
}

Assistant:

int *
f3_get_stem_contributions_d0(vrna_fold_compound_t       *fc,
                             int                        i,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f3       *sc_wrapper)
{
  char                    **ptype;
  short                   **S, *si;
  unsigned int            s, n_seq, type, length;
  int                     energy, j, max_j, turn, *c, *stems, maxdist;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f3_split_in_ext_stem *sc_spl_stem;
  sc_f3_reduce_to_stem    *sc_red_stem;

  length  = fc->length;
  maxdist = fc->window_size;
  P       = fc->params;
  md      = &(P->model_details);
  c       = fc->matrices->c_local[i];
  c       -= i;
  turn    = md->min_loop_size;
  si      = NULL;
  ptype   = (fc->type == VRNA_FC_TYPE_SINGLE) ? fc->ptype_local : NULL;
  n_seq   = (fc->type == VRNA_FC_TYPE_SINGLE) ? 1 : fc->n_seq;
  S       = (fc->type == VRNA_FC_TYPE_SINGLE) ? NULL : fc->S;

  stems = (int *)vrna_alloc(sizeof(int) * (maxdist + 6));
  stems -= i;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  max_j = MIN2(length - 1, i + maxdist);

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          type      = vrna_get_ptype_window(i, j, ptype);
          stems[j]  = c[j] +
                      vrna_E_ext_stem(type, -1, -1, P);
        }
      }
      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      si = (short *)vrna_alloc(sizeof(short) * n_seq);

      for (s = 0; s < n_seq; s++)
        si[s] = S[s][i];

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          energy = c[j];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, -1, -1, P);
          }
          stems[j] = energy;
        }
      }
      break;
  }


  if (sc_spl_stem)
    for (j = i + turn + 1; j <= max_j; j++)
      if (stems[j] != INF)
        stems[j] += sc_spl_stem(i, j, j + 1, sc_wrapper);

  if (length <= i + maxdist) {
    j         = length;
    stems[j]  = INF;

    if ((c[j] != INF) &&
        (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
      energy = c[j];

      switch (fc->type) {
        case VRNA_FC_TYPE_SINGLE:
          type    = vrna_get_ptype_window(i, j, ptype);
          energy  += vrna_E_ext_stem(type, -1, -1, P);

          break;

        case VRNA_FC_TYPE_COMPARATIVE:
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, -1, -1, P);
          }

          break;
      }

      if (sc_red_stem)
        energy += sc_red_stem(i, i, j, sc_wrapper);

      stems[j] = energy;
    }
  } else {
    /*
     * make sure we do not take (i + maxdist + 1) into account when
     * decomposing for odd dangle models
     */
    stems[i + maxdist + 1] = INF;
  }

  free(si);

  return stems;
}